

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-bench.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false> _Var1;
  unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  uVar2;
  undefined1 *puVar3;
  key_type pBVar4;
  undefined8 uVar5;
  undefined1 auVar6 [8];
  _Link_type p_Var7;
  Module *pMVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  int extraout_EAX;
  LLVMControlDependenceAnalysis *pLVar12;
  tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  tVar13;
  clock_t cVar14;
  clock_t cVar15;
  ostream *poVar16;
  Module *pMVar17;
  _Base_ptr p_Var18;
  undefined1 *puVar19;
  mapped_type *pmVar20;
  pointer pSVar21;
  BasicBlock *pBVar22;
  _Link_type p_Var23;
  _Link_type p_Var24;
  pointer pSVar25;
  pointer pSVar26;
  int iVar27;
  _Base_ptr p_Var28;
  _Vector_base<StackNode,_std::allocator<StackNode>_> *p_Var29;
  Module *pMVar30;
  BasicBlock *pBVar31;
  pointer __k;
  ulong uVar32;
  pointer *__ptr;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it;
  pointer ptVar33;
  pointer pSVar34;
  ulong uVar35;
  key_type *ppBVar36;
  _Link_type p_Var37;
  undefined1 *puVar38;
  int iVar39;
  int iVar40;
  __uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  _Var41;
  long lVar42;
  _Vector_base<StackNode,_std::allocator<StackNode>_> *this;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_1;
  Function *pFVar43;
  pointer ptVar44;
  undefined1 auVar45 [16];
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  analyses;
  Value *d;
  vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
  results;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_2;
  Function *__range3;
  iterator __end3;
  LLVMContext context;
  SlicerOptions options;
  key_type pBStack_448;
  pointer pSStack_440;
  ulong uStack_438;
  int iStack_430;
  int iStack_42c;
  undefined1 *puStack_428;
  ulong uStack_420;
  undefined1 auStack_418 [16];
  _Link_type p_Stack_408;
  _Base_ptr p_Stack_400;
  _Base_ptr p_Stack_3f8;
  size_t sStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3b8 [24];
  undefined1 local_3a0 [8];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  local_398;
  _Base_ptr local_378;
  uint local_36c;
  undefined1 local_368 [40];
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_340;
  CDAlgorithm local_310;
  bool local_30c;
  undefined2 local_30b;
  Module *local_300;
  pointer local_2f8;
  Module *local_2f0;
  Module *local_2e8;
  Module *local_2e0;
  LLVMControlDependenceAnalysis *local_2d8;
  Module *local_2d0;
  Module *local_2c8;
  pointer local_2c0;
  Module *local_2b8;
  Module *local_2b0;
  undefined1 local_2a8 [280];
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false> local_170;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_168;
  CDAlgorithm local_138;
  undefined1 local_134;
  undefined2 local_133;
  
  setupStackTraceOnError(argc,argv);
  puVar38 = local_2a8 + 8;
  iVar27 = 1;
  parseSlicerOptions((int)puVar38,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  if (total_only[0x80] == '\x01') {
    local_368[0] = 1;
    quiet[0x80] = '\x01';
    if (quiet._176_8_ == 0) {
      std::__throw_bad_function_call();
      uStack_3e8 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Function \'",10);
      auVar45 = llvm::Value::getName();
      lVar42 = auVar45._0_8_;
      auStack_418._0_8_ = &p_Stack_408;
      if (lVar42 == 0) {
        auStack_418._8_8_ = 0;
        p_Stack_408 = (_Link_type)((ulong)p_Stack_408 & 0xffffffffffffff00);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_418,lVar42,auVar45._8_8_ + lVar42);
      }
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)auStack_418._0_8_,auStack_418._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\'\n",2);
      if ((_Link_type *)auStack_418._0_8_ != &p_Stack_408) {
        operator_delete((void *)auStack_418._0_8_,
                        (ulong)((long)&(p_Stack_408->super__Rb_tree_node_base)._M_color + 1));
      }
      pSVar34 = (pointer)(puVar38 + 0x48);
      puVar19 = *(undefined1 **)(puVar38 + 0x50);
      if ((pointer)puVar19 != pSVar34) {
        iVar27 = 0;
        pSStack_440 = pSVar34;
        puStack_428 = puVar38;
        do {
          uStack_438 = CONCAT44(uStack_438._4_4_,iVar27);
          puVar38 = puVar19 + -0x18;
          if (puVar19 == (undefined1 *)0x0) {
            puVar38 = (undefined1 *)0x0;
          }
          for (puVar3 = *(undefined1 **)(puVar38 + 0x30); puVar3 != puVar38 + 0x28;
              puVar3 = *(undefined1 **)(puVar3 + 8)) {
          }
          lVar42 = llvm::BasicBlock::getTerminator();
          iVar27 = 0;
          if ((lVar42 != 0) && (iVar10 = llvm::Instruction::getNumSuccessors(), iVar10 != 0)) {
            iVar39 = 0;
            do {
              llvm::Instruction::getSuccessor((uint)lVar42);
              iVar39 = iVar39 + 1;
              iVar27 = iVar10;
            } while (iVar10 != iVar39);
          }
          iVar27 = (int)uStack_438 + (uint)(iVar27 == 0);
          puVar19 = *(undefined1 **)(puVar19 + 8);
          pSVar34 = pSStack_440;
          puVar38 = puStack_428;
        } while ((pointer)puVar19 != pSStack_440);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  bblocks: ",0xb);
      for (puVar19 = *(undefined1 **)(puVar38 + 0x50); (pointer)puVar19 != pSVar34;
          puVar19 = *(undefined1 **)(puVar19 + 8)) {
      }
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uStack_438 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  instructions: ",0x10);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  branches: ",0xc);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  blind ends: ",0xe)
      ;
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      p_Stack_400 = (_Base_ptr)(auStack_418 + 8);
      auStack_418._8_8_ = auStack_418._8_8_ & 0xffffffff00000000;
      p_Stack_408 = (_Link_type)0x0;
      uStack_420 = 0;
      sStack_3f0 = 0;
      pBStack_448 = (key_type)(*(long *)(puVar38 + 0x50) + -0x18);
      if (*(long *)(puVar38 + 0x50) == 0) {
        pBStack_448 = (key_type)0x0;
      }
      ppBVar36 = &pBStack_448;
      p_Stack_3f8 = p_Stack_400;
      pmVar20 = std::
                map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                ::operator[]((map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                              *)auStack_418,ppBVar36);
      *pmVar20 = true;
      pBVar22 = (BasicBlock *)(*(long *)(puVar38 + 0x50) + -0x18);
      if (*(long *)(puVar38 + 0x50) == 0) {
        pBVar22 = (BasicBlock *)0x0;
      }
      lVar42 = llvm::BasicBlock::getTerminator();
      pBVar31 = (BasicBlock *)0x0;
      if (lVar42 != 0) {
        iVar27 = llvm::Instruction::getNumSuccessors();
        if (iVar27 == 0) {
          pBVar31 = (BasicBlock *)0x0;
        }
        else {
          uVar11 = llvm::BasicBlock::getTerminator();
          ppBVar36 = (key_type *)0x0;
          pBVar31 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar11);
        }
      }
      pSVar21 = std::_Vector_base<StackNode,_std::allocator<StackNode>_>::_M_allocate
                          ((_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x1,
                           (size_t)ppBVar36);
      pSVar21->block = pBVar22;
      pSVar21->next_succ = pBVar31;
      pSStack_440 = pSVar21 + 1;
      puStack_428 = (undefined1 *)((ulong)puStack_428 & 0xffffffff00000000);
      iStack_430 = 0;
      iStack_42c = 0;
      pSVar34 = pSStack_440;
      do {
        __k = pSVar34 + -1;
        pBStack_448 = pSVar34[-1].next_succ;
        pSVar25 = pSVar21;
        if (pBStack_448 == (key_type)0x0) {
          pmVar20 = std::
                    map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                    ::operator[]((map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                                  *)auStack_418,&__k->block);
          *pmVar20 = false;
        }
        else {
          lVar42 = llvm::BasicBlock::getTerminator();
          uVar11 = (uint)lVar42;
          iVar27 = 0;
          if (lVar42 == 0) {
            iVar10 = 0;
          }
          else {
            iVar39 = llvm::Instruction::getNumSuccessors();
            iVar10 = 0;
            if (iVar39 != 0) {
              iVar40 = 0;
              do {
                pBVar22 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar11);
                iVar27 = iVar39;
                iVar10 = iVar40;
                if (pBVar22 == pSVar34[-1].next_succ) break;
                iVar40 = iVar40 + 1;
                iVar10 = iVar39;
              } while (iVar39 != iVar40);
            }
          }
          llvm::Instruction::getSuccessor(uVar11);
          for (; iVar10 != iVar27; iVar10 = iVar10 + 1) {
            pBVar22 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar11);
            if (pBVar22 != pSVar34[-1].next_succ) {
              if (iVar27 != iVar10) {
                pBVar22 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar11);
                goto LAB_001082e0;
              }
              break;
            }
          }
          pBVar22 = (BasicBlock *)0x0;
LAB_001082e0:
          pSVar34[-1].next_succ = pBVar22;
          if (p_Stack_408 != (_Link_type)0x0) {
            p_Var24 = (_Link_type)(auStack_418 + 8);
            p_Var7 = p_Stack_408;
            do {
              p_Var37 = p_Var7;
              p_Var23 = p_Var24;
              pBVar4 = *(key_type *)(p_Var37->_M_storage)._M_storage;
              p_Var24 = p_Var37;
              if (pBVar4 < pBStack_448) {
                p_Var24 = p_Var23;
              }
              p_Var7 = *(_Link_type *)
                        ((long)(&p_Var37->_M_storage + -1) + (ulong)(pBVar4 < pBStack_448) * 8);
            } while (*(_Link_type *)
                      ((long)(&p_Var37->_M_storage + -1) + (ulong)(pBVar4 < pBStack_448) * 8) !=
                     (_Link_type)0x0);
            if (p_Var24 != (_Link_type)(auStack_418 + 8)) {
              if (pBVar4 < pBStack_448) {
                p_Var37 = p_Var23;
              }
              if (*(key_type *)(p_Var37->_M_storage)._M_storage <= pBStack_448) {
                iStack_430 = iStack_430 + 1;
                uVar11 = (uint)(p_Var24->_M_storage)._M_storage[8];
                uStack_420 = (ulong)((int)uStack_420 + uVar11);
                iStack_42c = iStack_42c + (uVar11 ^ 1);
                (p_Var24->_M_storage)._M_storage[8] = '\0';
                goto LAB_00108483;
              }
            }
          }
          ppBVar36 = &pBStack_448;
          pmVar20 = std::
                    map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                    ::operator[]((map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                                  *)auStack_418,ppBVar36);
          *pmVar20 = true;
          lVar42 = llvm::BasicBlock::getTerminator();
          if ((lVar42 == 0) || (iVar27 = llvm::Instruction::getNumSuccessors(), iVar27 == 0)) {
            pBVar22 = (BasicBlock *)0x0;
          }
          else {
            uVar11 = llvm::BasicBlock::getTerminator();
            ppBVar36 = (key_type *)0x0;
            pBVar22 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar11);
          }
          if (pSVar34 == pSStack_440) {
            uVar32 = (long)pSVar34 - (long)pSVar21;
            if (uVar32 == 0x7ffffffffffffff0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            p_Var29 = (_Vector_base<StackNode,_std::allocator<StackNode>_> *)((long)uVar32 >> 3);
            this = (_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x7ffffffffffffff;
            if (p_Var29 < (_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x7ffffffffffffff)
            {
              this = p_Var29;
            }
            if (p_Var29 < (_Vector_base<StackNode,_std::allocator<StackNode>_> *)((long)uVar32 >> 4)
               ) {
              this = (_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x7ffffffffffffff;
            }
            pSVar25 = std::_Vector_base<StackNode,_std::allocator<StackNode>_>::_M_allocate
                                (this,(size_t)ppBVar36);
            *(key_type *)((long)pSVar25 + uVar32) = pBStack_448;
            *(BasicBlock **)((long)pSVar25 + uVar32 + 8) = pBVar22;
            __k = pSVar25 + 1;
            pSVar26 = pSVar21;
            do {
              pBVar22 = pSVar26->next_succ;
              __k[-1].block = pSVar26->block;
              __k[-1].next_succ = pBVar22;
              pSVar26 = pSVar26 + 1;
              __k = __k + 1;
            } while (pSVar26 != pSVar34);
            if (pSVar21 != (pointer)0x0) {
              operator_delete(pSVar21,uVar32);
            }
            pSStack_440 = pSVar25 + (long)this;
          }
          else {
            pSVar34->block = pBStack_448;
            pSVar34->next_succ = pBVar22;
            __k = pSVar34 + 1;
          }
          puStack_428 = (undefined1 *)CONCAT44(puStack_428._4_4_,(int)puStack_428 + 1);
          uVar32 = (long)__k - (long)pSVar25 >> 4;
          if (uStack_438 <= uVar32) {
            uStack_438 = uVar32;
          }
        }
LAB_00108483:
        pSVar34 = __k;
        pSVar21 = pSVar25;
        if (pSVar25 == __k) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS tree edges: ",0x12);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS nontree edges: ",0x15);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS forward: ",0xf);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS backedges: ",0x11);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS max depth: ",0x11);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          if (__k != (pointer)0x0) {
            operator_delete(pSVar25,(long)pSStack_440 - (long)__k);
          }
          std::
          _Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_bool>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_bool>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
          ::_M_erase((_Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_bool>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_bool>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                      *)auStack_418,p_Stack_408);
          return extraout_EAX;
        }
      } while( true );
    }
    (*(code *)quiet._184_8_)(0x1102f8,local_368);
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_2a8);
  parseModule(local_3a0,(LLVMContext *)"llvm-cda-bench",(SlicerOptions *)local_2a8);
  auVar6 = local_3a0;
  if (local_3a0 != (undefined1  [8])0x0) {
    if (fun_info_only[0x80] == '\x01') {
      iVar27 = 0;
      for (pMVar17 = *(Module **)((long)local_3a0 + 0x20);
          pMVar17 != (Module *)((long)local_3a0 + 0x18U); pMVar17 = *(Module **)(pMVar17 + 8)) {
        pFVar43 = (Function *)(pMVar17 + -0x38);
        if (pMVar17 == (Module *)0x0) {
          pFVar43 = (Function *)0x0;
        }
        cVar9 = llvm::GlobalValue::isDeclaration();
        if (cVar9 == '\0') {
          dumpFunStats(pFVar43);
        }
      }
    }
    else {
      local_398.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (scd[0x80] == '\x01') {
        local_138 = STANDARD;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [4])0x10c2e8,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (ntscd[0x80] == '\x01') {
        local_138 = NTSCD;
        tVar13.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              )operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  ((LLVMControlDependenceAnalysis *)
                   tVar13.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl,
                   (Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ =
             tVar13.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[6],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [6])0x10c2e6,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0
           ) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (ntscd2[0x80] == '\x01') {
        local_138 = NTSCD2;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[7],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [7])"ntscd2",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (ntscd_ranganath[0x80] == '\x01') {
        local_138 = NTSCD_RANGANATH;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[16],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [16])"ntscd-ranganath",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (ntscd_ranganath_wrong[0x80] == '\x01') {
        local_138 = NTSCD_RANGANATH_ORIG;
        tVar13.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              )operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  ((LLVMControlDependenceAnalysis *)
                   tVar13.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl,
                   (Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ =
             tVar13.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[22],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [22])"ntscd-ranganath-wrong",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0
           ) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (ntscd_legacy[0x80] == '\x01') {
        local_138 = NTSCD_LEGACY;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[13],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [13])"ntscd-legacy",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (dod[0x80] == '\x01') {
        local_138 = DOD;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [4])"dod",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (dod_ranganath[0x80] == '\x01') {
        local_138 = DOD_RANGANATH;
        tVar13.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              )operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  ((LLVMControlDependenceAnalysis *)
                   tVar13.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl,
                   (Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ =
             tVar13.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[14],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [14])"dod-ranganath",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0
           ) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (dod_ntscd[0x80] == '\x01') {
        local_138 = DODNTSCD;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[10],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [10])"dod+ntscd",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar6 = local_3a0;
      if (scc[0x80] == '\x01') {
        local_138 = STRONG_CC;
        pLVar12 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar12,(Module *)auVar6,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar12;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [4])"scc",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      if (local_398.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_398.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Warning: No analysis to run specified, dumping just info about funs\n",0x44);
      }
      pMVar17 = *(Module **)((long)local_3a0 + 0x20);
      pMVar30 = (Module *)((long)local_3a0 + 0x18);
      pMVar8 = pMVar30;
      if (pMVar17 != pMVar30) {
        do {
          local_2e8 = pMVar8;
          pFVar43 = (Function *)(pMVar17 + -0x38);
          if (pMVar17 == (Module *)0x0) {
            pFVar43 = (Function *)0x0;
          }
          cVar9 = llvm::GlobalValue::isDeclaration();
          if (cVar9 == '\0') {
            ptVar33 = local_398.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ptVar44 = local_398.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (quiet[0x80] == '\0') {
              dumpFunStats(pFVar43);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Elapsed time: \n",0xf);
              ptVar33 = local_398.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ptVar44 = local_398.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            for (; pMVar30 = local_2e8, ptVar33 != ptVar44; ptVar33 = ptVar33 + 1) {
              cVar14 = clock();
              _Var1._M_head_impl =
                   (ptVar33->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                   ).
                   super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                   .
                   super__Head_base<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_false>
                   ._M_head_impl._M_t.
                   super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
              uVar2._M_t.
              super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
              ._M_t.
              super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
              .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
                   ((_Var1._M_head_impl)->_impl)._M_t;
              (**(code **)(*(long *)uVar2._M_t.
                                    super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                    .
                                    super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>
                                    ._M_head_impl + 0x20))
                        (uVar2._M_t.
                         super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                         .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>.
                         _M_head_impl,pFVar43);
              if (*(bool *)((long)&(_Var1._M_head_impl)->_options + 0x5c) == true) {
                uVar2._M_t.
                super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl
                     = ((_Var1._M_head_impl)->_interprocImpl)._M_t;
                (**(code **)(*(long *)uVar2._M_t.
                                      super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                      .
                                      super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>
                                      ._M_head_impl + 0x20))
                          (uVar2._M_t.
                           super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                           .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>.
                           _M_head_impl,pFVar43);
              }
              cVar15 = clock();
              (ptVar33->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
              ).
              super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
              .super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
              _M_head_impl = (ptVar33->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                             ).
                             super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                             .super__Tuple_impl<2UL,_unsigned_long>.
                             super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                             (cVar15 - cVar14);
              if (quiet[0x80] == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     (ptVar33->
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                     ).
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     ._M_head_impl._M_dataplus._M_p,
                                     (ptVar33->
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                     ).
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     ._M_head_impl._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,": ",2);
                poVar16 = std::ostream::_M_insert<double>
                                    ((double)((float)(cVar15 - cVar14) / 1e+06));
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," s (",4);
                poVar16 = std::ostream::_M_insert<long>((long)poVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," ticks)\n",8);
              }
            }
            if (quiet[0x80] == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-----",5);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
              std::ostream::put(' ');
              std::ostream::flush();
            }
          }
          pMVar17 = *(Module **)(pMVar17 + 8);
          pMVar8 = local_2e8;
        } while (pMVar17 != pMVar30);
      }
      if ((quiet[0x80] == '\0') || (total_only[0x80] == '\x01')) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Total elapsed time:\n",0x14);
        ptVar33 = local_398.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ptVar44 = local_398.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ptVar44 != ptVar33;
            ptVar44 = ptVar44 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               (ptVar44->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               ).
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_dataplus._M_p,
                               (ptVar44->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               ).
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": ",2);
          poVar16 = std::ostream::_M_insert<double>
                              ((double)((float)(ptVar44->
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                               ).
                                               super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                               .super__Tuple_impl<2UL,_unsigned_long>.
                                               super__Head_base<2UL,_unsigned_long,_false>.
                                               _M_head_impl / 1e+06));
          std::__ostream_insert<char,std::char_traits<char>>(poVar16," s (",4);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16," ticks)",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          std::ostream::put((char)poVar16);
          std::ostream::flush();
        }
      }
      if (compare[0x80] == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n ==== Comparison ====\n",0x17);
        pMVar17 = *(Module **)((long)local_3a0 + 0x20);
        pMVar30 = (Module *)((long)local_3a0 + 0x18);
        pMVar8 = pMVar30;
        if (pMVar17 != pMVar30) {
          do {
            local_2d0 = pMVar8;
            local_2f0 = pMVar17 + -0x38;
            if (pMVar17 == (Module *)0x0) {
              local_2f0 = (Module *)0x0;
            }
            cVar9 = llvm::GlobalValue::isDeclaration();
            if (cVar9 == '\0') {
              local_368._0_8_ = (_Base_ptr)0x0;
              local_368._8_8_ = (_Base_ptr)0x0;
              local_368._16_8_ = 0;
              local_2c8 = pMVar17;
              std::
              vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
              ::resize((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                        *)local_368,
                       ((long)local_398.
                              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_398.
                              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
              ;
              local_2f8 = local_398.
                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_2c0 = local_398.
                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              if (local_398.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_398.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_2e0 = local_2f0 + 0x48;
                local_36c = 0;
                do {
                  pMVar17 = *(Module **)(local_2f0 + 0x50);
                  if (pMVar17 != local_2e0) {
                    local_2d8 = (local_2f8->
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                ).
                                super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                .
                                super__Head_base<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_false>
                                ._M_head_impl._M_t.
                                super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>.
                                _M_head_impl;
                    uVar32 = (ulong)local_36c;
                    do {
                      pMVar30 = pMVar17 + -0x18;
                      if (pMVar17 == (Module *)0x0) {
                        pMVar30 = (Module *)0x0;
                      }
                      local_2b8 = pMVar17;
                      dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
                                ((LLVMControlDependenceAnalysis *)local_3b8,(BasicBlock *)local_2d8)
                      ;
                      uVar5 = local_3b8._8_8_;
                      for (pLVar12 = (LLVMControlDependenceAnalysis *)local_3b8._0_8_;
                          pLVar12 != (LLVMControlDependenceAnalysis *)uVar5;
                          pLVar12 = (LLVMControlDependenceAnalysis *)&pLVar12->_options) {
                        local_378 = (_Base_ptr)pLVar12->_module;
                        local_300 = pMVar30;
                        std::
                        _Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                        ::_M_emplace_unique<llvm::Value*&,llvm::BasicBlock*>
                                  ((_Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                                    *)(local_368._0_8_ + uVar32 * 0x30),(Value **)&local_378,
                                   (BasicBlock **)&local_300);
                      }
                      if ((tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                           )local_3b8._0_8_ !=
                          (_Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>)0x0) {
                        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ - local_3b8._0_8_);
                      }
                      pMVar17 = *(Module **)(pMVar30 + 0x30);
                      local_2b0 = pMVar30 + 0x28;
                      if (pMVar17 != local_2b0) {
                        do {
                          pMVar30 = pMVar17 + -0x18;
                          if (pMVar17 == (Module *)0x0) {
                            pMVar30 = (Module *)0x0;
                          }
                          local_2e8 = pMVar17;
                          dg::LLVMControlDependenceAnalysis::
                          _getDependencies<llvm::Instruction_const*>
                                    ((LLVMControlDependenceAnalysis *)local_3b8,
                                     (Instruction *)local_2d8);
                          uVar5 = local_3b8._8_8_;
                          for (_Var41._M_t.
                               super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                               .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>.
                               _M_head_impl = (tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                               )(tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                                 )local_3b8._0_8_;
                              _Var41._M_t.
                              super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                              .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>.
                              _M_head_impl !=
                              (tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                               )uVar5; _Var41._M_t.
                                       super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                       .
                                       super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>
                                       ._M_head_impl =
                                            (tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                             )((long)_Var41._M_t.
                                                                                                          
                                                  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                                  .
                                                  super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>
                                                  ._M_head_impl + 8)) {
                            local_378 = *(_Base_ptr *)
                                         _Var41._M_t.
                                         super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                         .
                                         super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>
                                         ._M_head_impl;
                            local_300 = pMVar30;
                            std::
                            _Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                            ::_M_emplace_unique<llvm::Value*&,llvm::Instruction*>
                                      ((_Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                                        *)(local_368._0_8_ + uVar32 * 0x30),(Value **)&local_378,
                                       (Instruction **)&local_300);
                          }
                          if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ !=
                              (LLVMControlDependenceAnalysis *)0x0) {
                            operator_delete((void *)local_3b8._0_8_,
                                            local_3b8._16_8_ - local_3b8._0_8_);
                          }
                          pMVar17 = *(Module **)(local_2e8 + 8);
                        } while (pMVar17 != local_2b0);
                      }
                      pMVar17 = *(Module **)(local_2b8 + 8);
                    } while (pMVar17 != local_2e0);
                  }
                  local_36c = local_36c + 1;
                  local_2f8 = local_2f8 + 1;
                } while (local_2f8 != local_2c0);
              }
              pMVar17 = local_2c8;
              if (local_368._8_8_ != local_368._0_8_) {
                uVar32 = 0;
                p_Var18 = (_Base_ptr)local_368._0_8_;
                p_Var28 = (_Base_ptr)local_368._8_8_;
                do {
                  if ((int)uVar32 != 0) {
                    lVar42 = 0;
                    do {
                      compareResults((set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                      *)(local_368._0_8_ + uVar32 * 0x30),
                                     (set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                      *)(local_368._0_8_ + lVar42),
                                     (string *)
                                     ((long)local_398.
                                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                      uVar32 * 0x30 + 0x10),
                                     (string *)
                                     ((long)local_398.
                                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar42 +
                                     0x10),(Function *)local_2f0);
                      lVar42 = lVar42 + 0x30;
                      p_Var18 = (_Base_ptr)local_368._0_8_;
                      p_Var28 = (_Base_ptr)local_368._8_8_;
                    } while (uVar32 * 0x30 != lVar42);
                  }
                  uVar32 = (ulong)((int)uVar32 + 1);
                  uVar35 = ((long)p_Var28 - (long)p_Var18 >> 4) * -0x5555555555555555;
                } while (uVar32 <= uVar35 && uVar35 - uVar32 != 0);
              }
              std::
              vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
              ::~vector((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                         *)local_368);
              pMVar30 = local_2d0;
            }
            pMVar17 = *(Module **)(pMVar17 + 8);
            pMVar8 = local_2d0;
          } while (pMVar17 != pMVar30);
        }
      }
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ::~vector(&local_398);
      iVar27 = 0;
    }
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)local_3a0);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_2a8);
  SlicerOptions::~SlicerOptions((SlicerOptions *)(local_2a8 + 8));
  return iVar27;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (total_only) {
        quiet = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cda-bench", context, options);
    if (!M)
        return 1;

    if (fun_info_only) {
        for (auto &F : *M) {
            if (F.isDeclaration()) {
                continue;
            }

            dumpFunStats(F);
        }
        return 0;
    }

    std::vector<
            std::tuple<std::string,
                       std::unique_ptr<LLVMControlDependenceAnalysis>, size_t>>
            analyses;

    clock_t start, end, elapsed;
    auto &opts = options.dgOptions.CDAOptions;
    if (scd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STANDARD;
        analyses.emplace_back("scd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD;
        analyses.emplace_back("ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd2) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD2;
        analyses.emplace_back("ntscd2", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH;
        analyses.emplace_back("ntscd-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (ntscd_ranganath_wrong) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH_ORIG;
        analyses.emplace_back("ntscd-ranganath-wrong",
                              createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_legacy) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD_LEGACY;
        analyses.emplace_back("ntscd-legacy", createAnalysis(M.get(), opts), 0);
    }
    if (dod) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::DOD;
        analyses.emplace_back("dod", createAnalysis(M.get(), opts), 0);
    }
    if (dod_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                DOD_RANGANATH;
        analyses.emplace_back("dod-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (dod_ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::DODNTSCD;
        analyses.emplace_back("dod+ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (scc) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STRONG_CC;
        analyses.emplace_back("scc", createAnalysis(M.get(), opts), 0);
    }

    if (analyses.empty()) {
        std::cerr << "Warning: No analysis to run specified, "
                     "dumping just info about funs\n";
    }

    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        if (!quiet) {
            dumpFunStats(F);
            std::cout << "Elapsed time: \n";
        }

        for (auto &it : analyses) {
            start = clock();
            std::get<1>(it)->compute(&F); // compute all the information
            end = clock();
            elapsed = end - start;
            std::get<2>(it) += elapsed;
            if (!quiet) {
                std::cout << "  " << std::get<0>(it) << ": "
                          << static_cast<float>(elapsed) / CLOCKS_PER_SEC
                          << " s (" << elapsed << " ticks)\n";
            }
        }
        if (!quiet) {
            std::cout << "-----" << std::endl;
        }
    }

    if (!quiet || total_only) {
        std::cout << "Total elapsed time:\n";
        for (auto &it : analyses) {
            std::cout << "  " << std::get<0>(it) << ": "
                      << static_cast<float>(std::get<2>(it)) / CLOCKS_PER_SEC
                      << " s (" << std::get<2>(it) << " ticks)" << std::endl;
        }
    }

    // compare the results if requested
    if (!compare)
        return 0;

    std::cout << "\n ==== Comparison ====\n";
    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        // not very efficient...
        std::vector<
                std::set<std::pair<const llvm::Value *, const llvm::Value *>>>
                results;
        results.resize(analyses.size());
        unsigned n = 0;
        for (auto &it : analyses) {
            auto *cda = std::get<1>(it).get();
            for (auto &B : F) {
                for (auto *d : cda->getDependencies(&B)) {
                    results[n].emplace(d, &B);
                }

                for (auto &I : B) {
                    for (auto *d : cda->getDependencies(&I)) {
                        results[n].emplace(d, &I);
                    }
                }
            }

            ++n;
        }

        for (n = 0; n < results.size(); ++n) {
            for (unsigned m = 0; m < n; ++m) {
                compareResults(results[n], results[m], std::get<0>(analyses[n]),
                               std::get<0>(analyses[m]), F);
            }
        }
    }

    return 0;
}